

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstantDelta
               (long constant,long frame_of_reference,idx_t count,long *values,bool *validity,
               void *data_ptr)

{
  long *plVar1;
  
  ReserveSpace((BitpackingCompressionState<long,_true,_long> *)data_ptr,0x10);
  WriteMetaData((BitpackingCompressionState<long,_true,_long> *)data_ptr,CONSTANT_DELTA);
  plVar1 = *(long **)((long)data_ptr + 0x40);
  *plVar1 = frame_of_reference;
  plVar1[1] = constant;
  *(long **)((long)data_ptr + 0x40) = plVar1 + 2;
  UpdateStats((BitpackingCompressionState<long,_true,_long> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}